

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

int Gia_ManLevelWithBoxes(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  float *pfVar9;
  Gia_Obj_t *pObj;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  float *pfVar16;
  float fVar17;
  
  iVar2 = p->nAnd2Delay + (uint)(p->nAnd2Delay == 0);
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,0x1e4,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  if (p->nBufs != 0) {
    __assert_fail("Gia_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,0x1e5,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  Gia_ManCleanLevels(p,p->nObjs);
  Gia_ObjSetLevel(p,p->pObjs,0);
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  for (iVar12 = 0; iVar3 = Tim_ManPiNum(p_00), iVar12 < iVar3; iVar12 = iVar12 + 1) {
    pGVar8 = Gia_ManCi(p,iVar12);
    fVar17 = Tim_ManGetCiArrival(p_00,iVar12);
    Gia_ObjSetLevel(p,pGVar8,(int)(fVar17 / (float)iVar2));
    Gia_ObjSetTravIdCurrent(p,pGVar8);
  }
  iVar12 = Tim_ManPiNum(p_00);
  iVar14 = 0;
  for (iVar3 = 0; iVar4 = Tim_ManBoxNum(p_00), iVar3 < iVar4; iVar3 = iVar3 + 1) {
    uVar5 = Tim_ManBoxInputNum(p_00,iVar3);
    uVar6 = Tim_ManBoxOutputNum(p_00,iVar3);
    pfVar9 = Tim_ManBoxDelayTable(p_00,iVar3);
    uVar1 = 0;
    iVar4 = iVar14;
    uVar15 = 0;
    if (0 < (int)uVar5) {
      uVar1 = uVar5;
      uVar15 = uVar5;
    }
    while (uVar1 != 0) {
      pGVar8 = Gia_ManCo(p,iVar4);
      iVar7 = Gia_ManLevelWithBoxes_rec
                        (p,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff));
      if (iVar7 != 0) {
        puts("Boxes are not in a topological order. Switching to level computation without boxes.");
        iVar2 = Gia_ManLevelNum(p);
        return iVar2;
      }
      Gia_ObjSetCoLevel(p,pGVar8);
      uVar1 = uVar1 - 1;
      iVar4 = iVar4 + 1;
    }
    uVar11 = 0;
    if (0 < (int)uVar6) {
      uVar11 = (ulong)uVar6;
    }
    pfVar16 = pfVar9 + 3;
    for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
      pGVar8 = Gia_ManCi(p,iVar12 + (int)uVar10);
      Gia_ObjSetTravIdCurrent(p,pGVar8);
      if (uVar5 != (int)pfVar9[1]) {
        __assert_fail("nBoxInputs == (int)pDelayTable[1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                      ,0x20c,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
      }
      uVar13 = 0;
      iVar4 = 0;
      while ((uVar15 != uVar13 &&
             (pObj = Gia_ManCo(p,iVar14 + (int)uVar13), pObj != (Gia_Obj_t *)0x0))) {
        if ((int)pfVar16[uVar13] != -1000000000) {
          iVar7 = Gia_ObjLevel(p,pObj);
          iVar7 = (int)pfVar16[uVar13] / iVar2 + iVar7;
          if (iVar4 <= iVar7) {
            iVar4 = iVar7;
          }
        }
        uVar13 = uVar13 + 1;
      }
      Gia_ObjSetLevel(p,pGVar8,iVar4);
      pfVar16 = pfVar16 + (int)uVar5;
    }
    iVar12 = uVar6 + iVar12;
    iVar14 = iVar14 + uVar5;
  }
  p->nLevels = 0;
  iVar2 = Tim_ManCoNum(p_00);
  iVar3 = Tim_ManPoNum(p_00);
  for (iVar2 = iVar2 - iVar3; iVar3 = Tim_ManCoNum(p_00), iVar2 < iVar3; iVar2 = iVar2 + 1) {
    pGVar8 = Gia_ManCo(p,iVar2);
    Gia_ManLevelWithBoxes_rec(p,pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff));
    Gia_ObjSetCoLevel(p,pGVar8);
    iVar3 = p->nLevels;
    iVar4 = Gia_ObjLevel(p,pGVar8);
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    p->nLevels = iVar4;
  }
  iVar2 = Tim_ManPoNum(p_00);
  if (iVar12 != p->vCis->nSize) {
    __assert_fail("curCi == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,0x221,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  if (iVar2 + iVar14 != p->vCos->nSize) {
    __assert_fail("curCo == Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,0x222,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  return p->nLevels;
}

Assistant:

int Gia_ManLevelWithBoxes( Gia_Man_t * p )
{
    int nAnd2Delay = p->nAnd2Delay ? p->nAnd2Delay : 1;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pObj, * pObjIn;
    int i, k, j, curCi, curCo, LevelMax;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManBufNum(p) == 0 );
    // copy const and real PIs
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ObjSetLevel( p, Gia_ManConst0(p), 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        Gia_ObjSetLevel( p, pObj, Tim_ManGetCiArrival(pManTime, i) / nAnd2Delay );
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        int nBoxInputs  = Tim_ManBoxInputNum( pManTime, i );
        int nBoxOutputs = Tim_ManBoxOutputNum( pManTime, i );
        float * pDelayTable = Tim_ManBoxDelayTable( pManTime, i );
        // compute level for TFI of box inputs
        for ( k = 0; k < nBoxInputs; k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
            {
                printf( "Boxes are not in a topological order. Switching to level computation without boxes.\n" );
                return Gia_ManLevelNum( p );
            }
            // set box input level
            Gia_ObjSetCoLevel( p, pObj );
        }
        // compute level for box outputs
        for ( k = 0; k < nBoxOutputs; k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            Gia_ObjSetTravIdCurrent( p, pObj );
            // evaluate delay of this output
            LevelMax = 0;
            assert( nBoxInputs == (int)pDelayTable[1] );
            for ( j = 0; j < nBoxInputs && (pObjIn = Gia_ManCo(p, curCo + j)); j++ )
                if ( (int)pDelayTable[3+k*nBoxInputs+j] != -ABC_INFINITY )
                    LevelMax = Abc_MaxInt( LevelMax, Gia_ObjLevel(p, pObjIn) + ((int)pDelayTable[3+k*nBoxInputs+j] / nAnd2Delay) );
            // set box output level
            Gia_ObjSetLevel( p, pObj, LevelMax );
        }
        curCo += nBoxInputs;
        curCi += nBoxOutputs;
    }
    // add remaining nodes
    p->nLevels = 0;
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetCoLevel( p, pObj );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
//    printf( "Max level is %d.\n", p->nLevels );
    return p->nLevels;
}